

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O0

void Fra_BmcPerformSimple(Aig_Man_t *pAig,int nFrames,int nBTLimit,int fRewrite,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  abctime aVar11;
  Fra_Bmc_t *p;
  Fra_Man_t *__ptr;
  Aig_Man_t *pAVar12;
  abctime aVar13;
  Aig_Man_t *pAVar14;
  Abc_Cex_t *pAVar15;
  uint local_9c;
  uint local_94;
  int iOutput;
  abctime clk;
  Aig_Man_t *pAigTemp;
  Fra_Bmc_t *pBmc;
  Fra_Man_t *pTemp;
  int fVerbose_local;
  int fRewrite_local;
  int nBTLimit_local;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  aVar11 = Abc_Clock();
  p = Fra_BmcStart(pAig,0,nFrames);
  __ptr = Fra_LcrAigPrepare(pAig);
  __ptr->pBmc = p;
  pAVar12 = Fra_BmcFrames(p,1);
  p->pAigFrames = pAVar12;
  if (fVerbose != 0) {
    iVar1 = Aig_ManCiNum(pAig);
    iVar2 = Aig_ManRegNum(pAig);
    iVar3 = Aig_ManCoNum(pAig);
    iVar4 = Aig_ManRegNum(pAig);
    uVar5 = Aig_ManRegNum(pAig);
    uVar6 = Aig_ManNodeNum(pAig);
    uVar7 = Aig_ManLevelNum(pAig);
    printf("AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n",(ulong)(uint)(iVar1 - iVar2),
           (ulong)(uint)(iVar3 - iVar4),(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
    uVar5 = Aig_ManCiNum(p->pAigFrames);
    uVar6 = Aig_ManCoNum(p->pAigFrames);
    uVar7 = Aig_ManNodeNum(p->pAigFrames);
    uVar8 = Aig_ManLevelNum(p->pAigFrames);
    printf("Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ",(ulong)(uint)nFrames,
           (ulong)uVar5,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8);
    Abc_Print(1,"%s =","Time");
    aVar13 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar13 - aVar11) * 1.0) / 1000000.0);
  }
  if (fRewrite != 0) {
    aVar11 = Abc_Clock();
    pAVar12 = p->pAigFrames;
    pAVar14 = Dar_ManRwsat(pAVar12,1,0);
    p->pAigFrames = pAVar14;
    Aig_ManStop(pAVar12);
    if (fVerbose != 0) {
      uVar5 = Aig_ManNodeNum(p->pAigFrames);
      uVar6 = Aig_ManLevelNum(p->pAigFrames);
      printf("Time-frames after rewriting:  Node = %6d. Lev = %5d.  ",(ulong)uVar5,(ulong)uVar6);
      Abc_Print(1,"%s =","Time");
      aVar13 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar13 - aVar11) * 1.0) / 1000000.0);
    }
  }
  aVar11 = Abc_Clock();
  iVar1 = Fra_FraigMiterAssertedOutput(p->pAigFrames);
  if (iVar1 < 0) {
    pAVar12 = Fra_FraigEquivence(p->pAigFrames,nBTLimit,1);
    p->pAigFraig = pAVar12;
    iVar1 = Fra_FraigMiterAssertedOutput(p->pAigFraig);
    if (p->pAigFraig->pData == (void *)0x0) {
      if (-1 < iVar1) {
        iVar2 = Aig_ManRegNum(pAig);
        iVar3 = Aig_ManCiNum(pAig);
        iVar4 = Aig_ManRegNum(pAig);
        iVar9 = Aig_ManCoNum(pAig);
        iVar10 = Aig_ManRegNum(pAig);
        pAVar15 = Abc_CexMakeTriv(iVar2,iVar3 - iVar4,iVar9 - iVar10,iVar1);
        pAig->pSeqModel = pAVar15;
      }
    }
    else {
      pAVar15 = Fra_SmlCopyCounterExample(pAig,p->pAigFrames,(int *)p->pAigFraig->pData);
      pAig->pSeqModel = pAVar15;
      if (p->pAigFraig->pData != (void *)0x0) {
        free(p->pAigFraig->pData);
        p->pAigFraig->pData = (void *)0x0;
      }
    }
  }
  else {
    iVar2 = Aig_ManRegNum(pAig);
    iVar3 = Aig_ManCiNum(pAig);
    iVar4 = Aig_ManRegNum(pAig);
    iVar9 = Aig_ManCoNum(pAig);
    iVar10 = Aig_ManRegNum(pAig);
    pAVar15 = Abc_CexMakeTriv(iVar2,iVar3 - iVar4,iVar9 - iVar10,iVar1);
    pAig->pSeqModel = pAVar15;
  }
  if (fVerbose != 0) {
    if (p->pAigFraig == (Aig_Man_t *)0x0) {
      local_94 = 0xffffffff;
    }
    else {
      local_94 = Aig_ManNodeNum(p->pAigFraig);
    }
    if (p->pAigFraig == (Aig_Man_t *)0x0) {
      local_9c = 0xffffffff;
    }
    else {
      local_9c = Aig_ManLevelNum(p->pAigFraig);
    }
    printf("Fraiged init frames: Node = %6d. Lev = %5d.  ",(ulong)local_94,(ulong)local_9c);
    Abc_Print(1,"%s =","Time");
    aVar13 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar13 - aVar11) * 1.0) / 1000000.0);
  }
  Fra_BmcStop(p);
  if (__ptr != (Fra_Man_t *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Fra_BmcPerformSimple( Aig_Man_t * pAig, int nFrames, int nBTLimit, int fRewrite, int fVerbose )
{
    extern Fra_Man_t * Fra_LcrAigPrepare( Aig_Man_t * pAig );
    Fra_Man_t * pTemp;
    Fra_Bmc_t * pBmc;
    Aig_Man_t * pAigTemp;
    abctime clk;
    int iOutput;
    // derive and fraig the frames
    clk = Abc_Clock();
    pBmc = Fra_BmcStart( pAig, 0, nFrames );
    pTemp = Fra_LcrAigPrepare( pAig );
    pTemp->pBmc = pBmc;
    pBmc->pAigFrames = Fra_BmcFrames( pBmc, 1 );
    if ( fVerbose )
    {
        printf( "AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n", 
            Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig), Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig), Aig_ManRegNum(pAig),
            Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
        printf( "Time-frames (%d):  PI/PO = %d/%d.  Node = %6d. Lev = %5d.  ", 
            nFrames, Aig_ManCiNum(pBmc->pAigFrames), Aig_ManCoNum(pBmc->pAigFrames), 
            Aig_ManNodeNum(pBmc->pAigFrames), Aig_ManLevelNum(pBmc->pAigFrames) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    if ( fRewrite )
    {
        clk = Abc_Clock();
        pBmc->pAigFrames = Dar_ManRwsat( pAigTemp = pBmc->pAigFrames, 1, 0 );
        Aig_ManStop( pAigTemp );
        if ( fVerbose )
        {
            printf( "Time-frames after rewriting:  Node = %6d. Lev = %5d.  ", 
                Aig_ManNodeNum(pBmc->pAigFrames), Aig_ManLevelNum(pBmc->pAigFrames) );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }
    clk = Abc_Clock();
    iOutput = Fra_FraigMiterAssertedOutput( pBmc->pAigFrames );
    if ( iOutput >= 0 )
        pAig->pSeqModel = Abc_CexMakeTriv( Aig_ManRegNum(pAig), Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig), Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig), iOutput );
    else
    {
        pBmc->pAigFraig = Fra_FraigEquivence( pBmc->pAigFrames, nBTLimit, 1 );
        iOutput = Fra_FraigMiterAssertedOutput( pBmc->pAigFraig );
        if ( pBmc->pAigFraig->pData )
        {
            pAig->pSeqModel = Fra_SmlCopyCounterExample( pAig, pBmc->pAigFrames, (int *)pBmc->pAigFraig->pData );
            ABC_FREE( pBmc->pAigFraig->pData );
        }
        else if ( iOutput >= 0 )
            pAig->pSeqModel = Abc_CexMakeTriv( Aig_ManRegNum(pAig), Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig), Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig), iOutput );
    }
    if ( fVerbose )
    {
        printf( "Fraiged init frames: Node = %6d. Lev = %5d.  ", 
            pBmc->pAigFraig? Aig_ManNodeNum(pBmc->pAigFraig) : -1,
            pBmc->pAigFraig? Aig_ManLevelNum(pBmc->pAigFraig) : -1 );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    Fra_BmcStop( pBmc );  
    ABC_FREE( pTemp );
}